

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O1

Graph * Omega_h::add_edges(Graph *__return_storage_ptr__,Graph *g1,Graph *g2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  Alloc *pAVar7;
  int iVar8;
  long *plVar9;
  string *psVar10;
  Alloc *pAVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  ScopedTimer omega_h_scoped_function_timer;
  LOs v2e1;
  LOs v2e2;
  LOs e2v1;
  Write<int> e2v;
  LOs v2e;
  LOs e2v2;
  type f;
  Read<int> deg;
  LOs deg2;
  LOs deg1;
  ScopedTimer local_2a9;
  Write<int> local_2a8;
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  Alloc *local_268;
  void *local_260;
  Alloc *local_258;
  void *local_250;
  Alloc *local_248;
  Alloc *local_240;
  Alloc *local_238;
  void *local_230;
  Alloc *local_228;
  pointer local_220;
  Write<int> local_218;
  Alloc *local_208;
  void *pvStack_200;
  undefined1 local_1f8 [48];
  Alloc *local_1c8;
  Alloc *pAStack_1c0;
  Alloc *local_1b8;
  void *pvStack_1b0;
  Write<int> local_1a8;
  Read<int> local_198;
  Alloc *local_188;
  void *local_180;
  Alloc *local_178;
  void *local_170;
  undefined1 local_168 [32];
  Alloc *local_148;
  void *local_140;
  Alloc *local_138;
  Alloc *local_130;
  Alloc *local_128;
  void *local_120;
  Read<int> *local_118;
  Omega_h *local_110;
  Omega_h *local_108;
  Omega_h *local_100;
  Graph *local_f8;
  void *local_f0;
  Alloc *local_e8;
  LOs local_e0;
  Read<int> local_d0;
  Read<int> local_c0;
  Read<int> local_b0;
  LOs local_a0;
  LOs local_90;
  Write<int> local_80;
  Read<signed_char> local_70;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_178 = (Alloc *)local_168;
  local_f8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,"");
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
  pAVar11 = (Alloc *)(plVar9 + 2);
  if ((Alloc *)*plVar9 == pAVar11) {
    local_1f8._0_8_ = pAVar11->size;
    local_1f8._8_8_ = plVar9[3];
    local_208 = (Alloc *)local_1f8;
  }
  else {
    local_1f8._0_8_ = pAVar11->size;
    local_208 = (Alloc *)*plVar9;
  }
  pvStack_200 = (void *)plVar9[1];
  *plVar9 = (long)pAVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_2a8.shared_alloc_.alloc = (Alloc *)local_298;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,'\x02');
  *(undefined2 *)&(local_2a8.shared_alloc_.alloc)->size = 0x3531;
  uVar12 = 0xf;
  if (local_208 != (Alloc *)local_1f8) {
    uVar12 = local_1f8._0_8_;
  }
  if (uVar12 < (ulong)((long)local_2a8.shared_alloc_.direct_ptr + (long)pvStack_200)) {
    uVar12 = 0xf;
    if (local_2a8.shared_alloc_.alloc != (Alloc *)local_298) {
      uVar12 = local_298._0_8_;
    }
    if ((ulong)((long)local_2a8.shared_alloc_.direct_ptr + (long)pvStack_200) <= uVar12) {
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_2a8,0,(char *)0x0,(ulong)local_208);
      goto LAB_002d7eb9;
    }
  }
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_208,(ulong)local_2a8.shared_alloc_.alloc);
LAB_002d7eb9:
  local_288._0_8_ = local_288 + 0x10;
  pAVar11 = (Alloc *)(plVar9 + 2);
  if ((Alloc *)*plVar9 == pAVar11) {
    local_288._16_8_ = pAVar11->size;
    local_288._24_8_ = plVar9[3];
  }
  else {
    local_288._16_8_ = pAVar11->size;
    local_288._0_8_ = (Alloc *)*plVar9;
  }
  local_288._8_8_ = plVar9[1];
  *plVar9 = (long)pAVar11;
  plVar9[1] = 0;
  *(undefined1 *)&pAVar11->size = 0;
  begin_code("add_edges",(char *)local_288._0_8_);
  pAVar11 = (Alloc *)(local_288 + 0x10);
  if ((Alloc *)local_288._0_8_ != pAVar11) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  if (local_2a8.shared_alloc_.alloc != (Alloc *)local_298) {
    operator_delete(local_2a8.shared_alloc_.alloc,local_298._0_8_ + 1);
  }
  if (local_208 != (Alloc *)local_1f8) {
    operator_delete(local_208,local_1f8._0_8_ + 1);
  }
  if (local_178 != (Alloc *)local_168) {
    operator_delete(local_178,local_168._0_8_ + 1);
  }
  local_2a8.shared_alloc_.alloc = (g1->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.shared_alloc_.alloc = (Alloc *)((local_2a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2a8.shared_alloc_.alloc)->use_count = (local_2a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.shared_alloc_.direct_ptr = (g1->a2ab).write_.shared_alloc_.direct_ptr;
  local_218.shared_alloc_.alloc = (g1->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218.shared_alloc_.alloc = (Alloc *)((local_218.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.shared_alloc_.alloc)->use_count = (local_218.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_218.shared_alloc_.direct_ptr = (g1->ab2b).write_.shared_alloc_.direct_ptr;
  local_228 = (g2->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228 = (Alloc *)(local_228->size * 8 + 1);
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  local_220 = (pointer)(g2->a2ab).write_.shared_alloc_.direct_ptr;
  local_188 = (g2->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_180 = (g2->ab2b).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_2a8.shared_alloc_.alloc & 1) == 0) {
    sVar15 = (local_2a8.shared_alloc_.alloc)->size;
  }
  else {
    sVar15 = (ulong)local_2a8.shared_alloc_.alloc >> 3;
  }
  local_90.write_.shared_alloc_.alloc = local_2a8.shared_alloc_.alloc;
  if (((ulong)local_2a8.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc = (Alloc *)((local_2a8.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      (local_2a8.shared_alloc_.alloc)->use_count = (local_2a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_288._0_8_ = pAVar11;
  local_90.write_.shared_alloc_.direct_ptr = local_2a8.shared_alloc_.direct_ptr;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"deg1","");
  get_degrees((Omega_h *)&local_40,&local_90,(string *)local_288);
  if ((Alloc *)local_288._0_8_ != pAVar11) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  pAVar7 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  local_a0.write_.shared_alloc_.alloc = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_228->size * 8 + 1);
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr = local_220;
  local_288._0_8_ = pAVar11;
  local_100 = (Omega_h *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"deg2","");
  get_degrees((Omega_h *)&local_50,&local_a0,(string *)local_288);
  local_108 = (Omega_h *)&local_50;
  if ((Alloc *)local_288._0_8_ != pAVar11) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  pAVar7 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  local_b0.write_.shared_alloc_.alloc = local_40;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = local_38;
  local_c0.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_c0.write_.shared_alloc_.direct_ptr = local_48;
  local_288._0_8_ = pAVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"deg1+2","");
  local_110 = (Omega_h *)&local_60;
  add_each<int>(local_110,&local_b0,&local_c0,(string *)local_288);
  if ((Alloc *)local_288._0_8_ != pAVar11) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  pAVar7 = local_c0.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  pAVar7 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  local_d0.write_.shared_alloc_.alloc = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  local_d0.write_.shared_alloc_.direct_ptr = local_58;
  psVar10 = Write<int>::name_abi_cxx11_(&local_2a8);
  pcVar6 = (psVar10->_M_dataplus)._M_p;
  local_288._0_8_ = pAVar11;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,pcVar6,pcVar6 + psVar10->_M_string_length);
  offset_scan<int>((Omega_h *)&local_198,&local_d0,(string *)local_288);
  if ((Alloc *)local_288._0_8_ != pAVar11) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  pAVar7 = local_d0.write_.shared_alloc_.alloc;
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  local_118 = &local_198;
  iVar8 = Read<int>::last(local_118);
  psVar10 = Write<int>::name_abi_cxx11_(&local_218);
  pcVar6 = (psVar10->_M_dataplus)._M_p;
  local_288._0_8_ = pAVar11;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,pcVar6,pcVar6 + psVar10->_M_string_length);
  Write<int>::Write(&local_1a8,iVar8,(string *)local_288);
  if ((Alloc *)local_288._0_8_ != pAVar11) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  local_178 = local_2a8.shared_alloc_.alloc;
  if (((ulong)local_2a8.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (Alloc *)((local_2a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2a8.shared_alloc_.alloc)->use_count = (local_2a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_170 = local_2a8.shared_alloc_.direct_ptr;
  local_168._0_8_ = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168._0_8_ = local_228->size * 8 + 1;
    }
    else {
      local_228->use_count = local_228->use_count + 1;
    }
  }
  local_168._8_8_ = local_220;
  local_168._16_8_ = local_198.write_.shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168._16_8_ = (local_198.write_.shared_alloc_.alloc)->size * 8 + 1;
    }
    else {
      (local_198.write_.shared_alloc_.alloc)->use_count =
           (local_198.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_168._24_8_ = local_198.write_.shared_alloc_.direct_ptr;
  local_148 = local_1a8.shared_alloc_.alloc;
  if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)((local_1a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1a8.shared_alloc_.alloc)->use_count = (local_1a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_140 = local_1a8.shared_alloc_.direct_ptr;
  local_138 = local_218.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)((local_218.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_218.shared_alloc_.alloc)->use_count = (local_218.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_130 = (Alloc *)local_218.shared_alloc_.direct_ptr;
  local_128 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_120 = local_180;
  local_208 = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (Alloc *)(local_178->size * 8 + 1);
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  pvStack_200 = local_2a8.shared_alloc_.direct_ptr;
  local_1f8._0_8_ = local_168._0_8_;
  if ((local_168._0_8_ & 7) == 0 && (Alloc *)local_168._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8._0_8_ = *(size_t *)local_168._0_8_ * 8 + 1;
    }
    else {
      *(int *)(local_168._0_8_ + 0x30) = *(int *)(local_168._0_8_ + 0x30) + 1;
    }
  }
  local_1f8._8_8_ = local_220;
  local_1f8._16_8_ = local_168._16_8_;
  if ((local_168._16_8_ & 7) == 0 && (Alloc *)local_168._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8._16_8_ = *(size_t *)local_168._16_8_ * 8 + 1;
    }
    else {
      *(int *)(local_168._16_8_ + 0x30) = *(int *)(local_168._16_8_ + 0x30) + 1;
    }
  }
  local_1f8._24_8_ = local_198.write_.shared_alloc_.direct_ptr;
  local_1f8._32_8_ = local_148;
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8._32_8_ = local_148->size * 8 + 1;
    }
    else {
      local_148->use_count = local_148->use_count + 1;
    }
  }
  local_1f8._40_8_ = local_1a8.shared_alloc_.direct_ptr;
  local_1c8 = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  local_e8 = (Alloc *)local_218.shared_alloc_.direct_ptr;
  pAStack_1c0 = (Alloc *)local_218.shared_alloc_.direct_ptr;
  local_1b8 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_f0 = local_180;
  pvStack_1b0 = local_180;
  if (1 < (int)(sVar15 >> 2)) {
    local_288._0_8_ = local_208;
    local_288._8_8_ = local_2a8.shared_alloc_.direct_ptr;
    if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
      local_208->use_count = local_208->use_count + -1;
      local_288._0_8_ = local_208->size * 8 + 1;
    }
    local_208 = (Alloc *)0x0;
    pvStack_200 = (void *)0x0;
    local_288._16_8_ = local_1f8._0_8_;
    local_288._24_8_ = local_220;
    if ((local_1f8._0_8_ & 7) == 0 && (Alloc *)local_1f8._0_8_ != (Alloc *)0x0) {
      *(int *)(local_1f8._0_8_ + 0x30) = *(int *)(local_1f8._0_8_ + 0x30) + -1;
      local_288._16_8_ = *(size_t *)local_1f8._0_8_ * 8 + 1;
    }
    local_1f8._0_8_ = (Alloc *)0x0;
    local_1f8._8_8_ = (pointer)0x0;
    local_268 = (Alloc *)local_1f8._16_8_;
    local_260 = local_198.write_.shared_alloc_.direct_ptr;
    if ((local_1f8._16_8_ & 7) == 0 && (Alloc *)local_1f8._16_8_ != (Alloc *)0x0) {
      *(int *)(local_1f8._16_8_ + 0x30) = *(int *)(local_1f8._16_8_ + 0x30) + -1;
      local_268 = (Alloc *)(*(size_t *)local_1f8._16_8_ * 8 + 1);
    }
    local_1f8._16_8_ = (Alloc *)0x0;
    local_1f8._24_8_ = 0;
    local_258 = (Alloc *)local_1f8._32_8_;
    local_250 = local_1a8.shared_alloc_.direct_ptr;
    if ((local_1f8._32_8_ & 7) == 0 && (Alloc *)local_1f8._32_8_ != (Alloc *)0x0) {
      *(int *)(local_1f8._32_8_ + 0x30) = *(int *)(local_1f8._32_8_ + 0x30) + -1;
      local_258 = (Alloc *)(*(long *)local_1f8._32_8_ * 8 + 1);
    }
    local_1f8._32_8_ = (Alloc *)0x0;
    local_1f8._40_8_ = (void *)0x0;
    local_248 = local_1c8;
    local_240 = (Alloc *)local_218.shared_alloc_.direct_ptr;
    if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
      local_1c8->use_count = local_1c8->use_count + -1;
      local_248 = (Alloc *)(local_1c8->size * 8 + 1);
    }
    local_1c8 = (Alloc *)0x0;
    pAStack_1c0 = (Alloc *)0x0;
    local_238 = local_1b8;
    local_230 = local_180;
    if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
      local_1b8->use_count = local_1b8->use_count + -1;
      local_238 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    local_1b8 = (Alloc *)0x0;
    pvStack_1b0 = (void *)0x0;
    entering_parallel = '\0';
    uVar12 = 0;
    while (uVar12 != ((sVar15 >> 2) + 0xffffffff & 0xffffffff)) {
      iVar8 = *(int *)((long)local_2a8.shared_alloc_.direct_ptr + uVar12 * 4);
      iVar2 = *(int *)((long)local_2a8.shared_alloc_.direct_ptr + uVar12 * 4 + 4);
      iVar3 = *(int *)(local_220 + uVar12 * 4);
      iVar4 = *(int *)(local_220 + uVar12 * 4 + 4);
      iVar13 = *(int *)((long)local_198.write_.shared_alloc_.direct_ptr + uVar12 * 4);
      iVar5 = *(int *)((long)local_198.write_.shared_alloc_.direct_ptr + uVar12 * 4 + 4);
      if (iVar8 < iVar2) {
        lVar14 = 0;
        do {
          *(undefined4 *)((long)local_1a8.shared_alloc_.direct_ptr + lVar14 * 4 + (long)iVar13 * 4)
               = *(undefined4 *)
                  ((long)(size_t *)local_218.shared_alloc_.direct_ptr + lVar14 * 4 + (long)iVar8 * 4
                  );
          lVar14 = lVar14 + 1;
        } while ((long)iVar2 - (long)iVar8 != lVar14);
        iVar13 = (int)lVar14 + iVar13;
      }
      if (iVar3 < iVar4) {
        lVar14 = 0;
        do {
          *(undefined4 *)((long)local_1a8.shared_alloc_.direct_ptr + lVar14 * 4 + (long)iVar13 * 4)
               = *(undefined4 *)((long)local_180 + lVar14 * 4 + (long)iVar3 * 4);
          lVar14 = lVar14 + 1;
        } while ((long)iVar4 - (long)iVar3 != lVar14);
        iVar13 = iVar13 + (int)lVar14;
      }
      uVar12 = uVar12 + 1;
      if (iVar13 != iVar5) {
        fail("assertion %s failed at %s +%d\n","k == end",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,0x24);
      }
    }
    add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)local_288);
  }
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&local_208);
  local_e0.write_.shared_alloc_.alloc = local_198.write_.shared_alloc_.alloc;
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0.write_.shared_alloc_.alloc =
           (Alloc *)((local_198.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_198.write_.shared_alloc_.alloc)->use_count =
           (local_198.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_e0.write_.shared_alloc_.direct_ptr = local_198.write_.shared_alloc_.direct_ptr;
  local_80.shared_alloc_.alloc = local_1a8.shared_alloc_.alloc;
  if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.shared_alloc_.alloc = (Alloc *)((local_1a8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1a8.shared_alloc_.alloc)->use_count = (local_1a8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.shared_alloc_.direct_ptr = local_1a8.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_70,&local_80);
  Graph::Graph(local_f8,&local_e0,(LOs *)&local_70);
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
      operator_delete(local_70.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar11 = local_80.shared_alloc_.alloc;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_80.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_e0.write_.shared_alloc_.alloc;
  if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e0.write_.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)&local_178);
  if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_1a8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a8.shared_alloc_.alloc);
      operator_delete(local_1a8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
      local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.write_.shared_alloc_.alloc);
      operator_delete(local_198.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(local_60,0x48);
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
    }
  }
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    piVar1 = &local_40->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40);
      operator_delete(local_40,0x48);
    }
  }
  pAVar11 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    piVar1 = &local_188->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_188);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_228;
  if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
    piVar1 = &local_228->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_228);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_218.shared_alloc_.alloc;
  if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
      local_218.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_218.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_218.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  pAVar11 = local_2a8.shared_alloc_.alloc;
  if (((ulong)local_2a8.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2a8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8.shared_alloc_.alloc);
      operator_delete(pAVar11,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_2a9);
  return local_f8;
}

Assistant:

Graph add_edges(Graph g1, Graph g2) {
  OMEGA_H_TIME_FUNCTION;
  auto v2e1 = g1.a2ab;
  auto e2v1 = g1.ab2b;
  auto v2e2 = g2.a2ab;
  auto e2v2 = g2.ab2b;
  auto nv = v2e1.size() - 1;
  auto deg1 = get_degrees(v2e1, "deg1");
  auto deg2 = get_degrees(v2e2, "deg2");
  auto deg = add_each(deg1, deg2, "deg1+2");
  auto v2e = offset_scan(deg, v2e1.name());
  Write<LO> e2v(v2e.last(), e2v1.name());
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto begin1 = v2e1[v];
    auto end1 = v2e1[v + 1];
    auto begin2 = v2e2[v];
    auto end2 = v2e2[v + 1];
    auto begin = v2e[v];
    auto end = v2e[v + 1];
    auto k = begin;
    for (auto j = begin1; j < end1; ++j) e2v[k++] = e2v1[j];
    for (auto j = begin2; j < end2; ++j) e2v[k++] = e2v2[j];
    OMEGA_H_CHECK(k == end);
  };
  parallel_for(nv, f, "add_edges");
  return Graph(v2e, e2v);
}